

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::report_selfint_edge
          (tetgenmesh *this,point e1,point e2,face *iedge,triface *itet,interresult dir)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pc;
  tetrahedron ppdVar4;
  long lVar5;
  shellface *pppdVar6;
  shellface *pppdVar7;
  shellface *pppdVar8;
  long lVar9;
  point pdVar10;
  point pdVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  shellface ppdVar21;
  uint uVar22;
  shellface ppdVar23;
  char *__format;
  ulong uVar24;
  shellface ppdVar25;
  shellface *pppdVar26;
  uint uVar27;
  double *in_stack_ffffffffffffff50;
  ulong local_a8;
  double ip [3];
  double tq;
  double tp;
  double u;
  
  if (iedge == (face *)0x0) {
    uVar20 = 0;
    uVar22 = 0;
    iVar16 = 0;
    ppdVar23 = (shellface)0x0;
    ppdVar21 = (shellface)0x0;
    ppdVar25 = (shellface)0x0;
  }
  else {
    pppdVar26 = iedge->sh;
    if (pppdVar26[5] == (shellface)0x0) {
      lVar15 = (long)iedge->shver;
      ppdVar23 = pppdVar26[snextpivot[snextpivot[lVar15]] >> 1];
      pppdVar6 = pppdVar26;
      lVar9 = lVar15;
      while (pppdVar7 = (shellface *)((ulong)ppdVar23 & 0xfffffffffffffff8),
            pppdVar7 != (shellface *)0x0) {
        uVar22 = (uint)ppdVar23 & 7;
        lVar9 = (long)snextpivot
                      [snextpivot
                       [pppdVar7[sorgpivot[uVar22]] != pppdVar6[sorgpivot[lVar9]] ^ uVar22]];
        pppdVar6 = pppdVar7;
        ppdVar23 = pppdVar7[snextpivot[snextpivot[lVar9]] >> 1];
      }
      ppdVar23 = pppdVar26[snextpivot[lVar15] >> 1];
      pppdVar7 = pppdVar26;
      while (pppdVar8 = (shellface *)((ulong)ppdVar23 & 0xfffffffffffffff8),
            pppdVar8 != (shellface *)0x0) {
        uVar22 = (uint)ppdVar23 & 7;
        lVar15 = (long)snextpivot
                       [pppdVar8[sdestpivot[uVar22]] != pppdVar7[sdestpivot[lVar15]] ^ uVar22];
        pppdVar7 = pppdVar8;
        ppdVar23 = pppdVar8[snextpivot[lVar15] >> 1];
      }
      ppdVar25 = pppdVar6[sorgpivot[lVar9]];
      ppdVar21 = pppdVar7[sdestpivot[lVar15]];
      if (((ulong)pppdVar26[iedge->shver >> 1] & 0xfffffffffffffff8) == 0) {
        lVar9 = (long)this->shmarkindex;
        uVar20 = 0;
      }
      else {
        lVar9 = (long)this->shmarkindex;
        uVar20 = (ulong)*(uint *)(((ulong)pppdVar26[iedge->shver >> 1] & 0xfffffffffffffff8) +
                                 lVar9 * 4);
      }
      iVar16 = 1;
      ppdVar23 = (shellface)0x0;
    }
    else {
      ppdVar23 = pppdVar26[sapexpivot[iedge->shver]];
      lVar9 = (long)this->shmarkindex;
      uVar20 = (ulong)*(uint *)((long)pppdVar26 + lVar9 * 4);
      iVar16 = 2;
      ppdVar21 = (shellface)e2;
      ppdVar25 = (shellface)e1;
    }
    uVar22 = *(uint *)((long)pppdVar26 + lVar9 * 4);
  }
  switch(dir) {
  case SHAREEDGE:
    if (itet->tet[8] == (tetrahedron)0x0) {
      uVar27 = 0;
      pppdVar26 = (shellface *)0x0;
    }
    else {
      pdVar2 = itet->tet[8][ver2edge[itet->ver]];
      uVar27 = (uint)pdVar2 & 7;
      pppdVar26 = (shellface *)((ulong)pdVar2 & 0xfffffffffffffff8);
    }
    if (iVar16 == 2) {
      puts("PLC Error:  A segment lies in a facet.");
      printf("  Segment: [%d, %d] #%d\n",
             (ulong)*(uint *)((long)pppdVar26[*(int *)((long)sorgpivot + (ulong)(uVar27 << 2))] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pppdVar26[*(int *)((long)sdestpivot + (ulong)(uVar27 << 2))] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pppdVar26 + (long)this->shmarkindex * 4));
      lVar9 = (long)this->pointmarkindex;
      uVar14 = (ulong)*(uint *)((long)ppdVar25 + lVar9 * 4);
      uVar12 = (ulong)*(uint *)((long)ppdVar21 + lVar9 * 4);
      uVar18 = (ulong)*(uint *)((long)ppdVar23 + lVar9 * 4);
      pcVar19 = "  Facet:   [%d,%d,%d] #%d\n";
      uVar20 = (ulong)uVar22;
    }
    else {
      if (iVar16 != 1) {
        return 0;
      }
      if (pppdVar26 == iedge->sh) goto switchD_00114e0d_caseD_5;
      uVar27 = uVar27 << 2;
      uVar18 = *(ulong *)((long)pppdVar26 + (ulong)(uVar27 & 0xfffffff8));
      puts("PLC Error:  Two segments are overlapping.");
      uVar18 = uVar18 & 0xfffffffffffffff8;
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4);
      }
      printf("  Segment 1: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)pppdVar26[*(int *)((long)sorgpivot + (ulong)uVar27)] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pppdVar26[*(int *)((long)sdestpivot + (ulong)uVar27)] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pppdVar26 + (long)this->shmarkindex * 4),uVar18);
      uVar14 = (ulong)*(uint *)((long)ppdVar25 + (long)this->pointmarkindex * 4);
      uVar12 = (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4);
      pcVar19 = "  Segment 2: [%d, %d] #%d (%d)\n";
      uVar18 = (ulong)uVar22;
    }
    goto LAB_001152d8;
  case SHAREFACE:
    if (itet->tet[9] == (tetrahedron)0x0) {
      lVar9 = 0;
      pppdVar26 = (shellface *)0x0;
    }
    else {
      pdVar2 = itet->tet[9][itet->ver & 3];
      pppdVar26 = (shellface *)((ulong)pdVar2 & 0xfffffffffffffff8);
      lVar9 = (long)tspivottbl[itet->ver][(uint)pdVar2 & 7];
    }
    if ((iVar16 != 2) || (pppdVar26 == iedge->sh)) goto switchD_00114e0d_caseD_5;
    puts("PLC Error:  Two facets are overlapping.");
    lVar15 = (long)this->pointmarkindex;
    printf("  Facet 1:  [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)ppdVar25 + lVar15 * 4),
           (ulong)*(uint *)((long)ppdVar21 + lVar15 * 4),
           (ulong)*(uint *)((long)ppdVar23 + lVar15 * 4),(ulong)uVar22);
    lVar15 = (long)this->pointmarkindex;
    uVar14 = (ulong)*(uint *)((long)pppdVar26[sorgpivot[lVar9]] + lVar15 * 4);
    uVar12 = (ulong)*(uint *)((long)pppdVar26[sdestpivot[lVar9]] + lVar15 * 4);
    uVar18 = (ulong)*(uint *)((long)pppdVar26[sapexpivot[lVar9]] + lVar15 * 4);
    uVar20 = (ulong)*(uint *)((long)pppdVar26 + (long)this->shmarkindex * 4);
    pcVar19 = "  Facet 2:  [%d,%d,%d] #%d\n";
LAB_001152d8:
    printf(pcVar19,uVar14,uVar12,uVar18,uVar20);
    return 0;
  default:
switchD_00114e0d_caseD_5:
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    puts("  command line you used to run this program, thank you.");
    exit(2);
  case ACROSSVERT:
    local_a8 = (ulong)uVar22;
    ppdVar4 = itet->tet[destpivot[itet->ver]];
    switch(*(int *)((long)ppdVar4 + (long)this->pointmarkindex * 4 + 4) >> 8) {
    case 2:
    case 4:
    case 5:
      if (iVar16 == 2) {
        puts("PLC Error:  A vertex lies in a facet.");
        printf("  Vertex: [%d] (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],ppdVar4[2],
               (ulong)*(uint *)((long)ppdVar4 + (long)this->pointmarkindex * 4));
        lVar9 = (long)this->pointmarkindex;
        uVar17 = (ulong)*(uint *)((long)ppdVar25 + lVar9 * 4);
        uVar14 = (ulong)*(uint *)((long)ppdVar21 + lVar9 * 4);
        uVar12 = (ulong)*(uint *)((long)ppdVar23 + lVar9 * 4);
        __format = "  Facet:  [%d,%d,%d] #%d\n";
      }
      else {
        if (iVar16 != 1) goto LAB_00115804;
        puts("PLC Error:  A vertex lies in a segment.");
        printf("  Vertex:  [%d] (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],ppdVar4[2],
               (ulong)*(uint *)((long)ppdVar4 + (long)this->pointmarkindex * 4));
        uVar17 = (ulong)*(uint *)((long)ppdVar25 + (long)this->pointmarkindex * 4);
        uVar14 = (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4);
        __format = "  Segment: [%d, %d] #%d (%d)\n";
        uVar12 = (ulong)uVar22;
        local_a8 = uVar20;
      }
      break;
    default:
switchD_0011536f_caseD_3:
      terminatetetgen(this,2);
      goto LAB_00115804;
    case 6:
      uVar27 = (uint)ppdVar4[(long)this->point2simindex + 2];
      ip[1]._0_4_ = uVar27 & 7;
      ip[0] = (double)((ulong)ppdVar4[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
      uVar18 = *(ulong *)((long)ip[0] + (ulong)(uVar27 & 6) * 4) & 0xfffffffffffffff8;
      pdVar10 = farsorg(this,(face *)ip);
      pdVar11 = farsdest(this,(face *)ip);
      if (iVar16 == 2) {
        uVar22 = 0;
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],ppdVar4[2]);
        if (uVar18 != 0) {
          uVar22 = *(uint *)(uVar18 + (long)this->shmarkindex * 4);
        }
        printf("  Segment: [%d, %d], #%d (%d)\n",
               (ulong)*(uint *)((long)pdVar10 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)pdVar11 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)ip[0] + (long)this->shmarkindex * 4),(ulong)uVar22);
        lVar9 = (long)this->pointmarkindex;
        uVar17 = (ulong)*(uint *)((long)ppdVar25 + lVar9 * 4);
        uVar14 = (ulong)*(uint *)((long)ppdVar21 + lVar9 * 4);
        uVar12 = (ulong)*(uint *)((long)ppdVar23 + lVar9 * 4);
        __format = "  Facet:   [%d,%d,%d] #%d\n";
      }
      else {
        if (iVar16 != 1) goto LAB_00115804;
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],
               ppdVar4[2]);
        printf("  Segment 1: [%d, %d], #%d (%d)\n",
               (ulong)*(uint *)((long)ppdVar25 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4),uVar22,uVar20);
        uVar17 = (ulong)*(uint *)((long)pdVar10 + (long)this->pointmarkindex * 4);
        uVar14 = (ulong)*(uint *)((long)pdVar11 + (long)this->pointmarkindex * 4);
        uVar12 = (ulong)*(uint *)((long)ip[0] + (long)this->shmarkindex * 4);
        __format = "  Segment 2: [%d, %d], #%d (%d)\n";
        if (uVar18 != 0) {
          uVar22 = *(uint *)(uVar18 + (long)this->shmarkindex * 4);
          goto LAB_0011567b;
        }
LAB_001150e5:
        local_a8 = 0;
      }
      break;
    case 7:
      uVar18 = (ulong)ppdVar4[(long)this->point2simindex + 2] & 0xfffffffffffffff8;
      if (uVar18 == 0) goto switchD_0011536f_caseD_3;
      uVar12 = (ulong)(((uint)ppdVar4[(long)this->point2simindex + 2] & 7) << 2);
      lVar9 = *(long *)(uVar18 + (long)*(int *)((long)sorgpivot + uVar12) * 8);
      lVar15 = *(long *)(uVar18 + (long)*(int *)((long)sdestpivot + uVar12) * 8);
      lVar5 = *(long *)(uVar18 + (long)*(int *)((long)sapexpivot + uVar12) * 8);
      if (iVar16 == 2) {
        printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],
               ppdVar4[2]);
        lVar13 = (long)this->pointmarkindex;
        printf("  Facet 1: [%d, %d, %d] #%d.\n",(ulong)*(uint *)((long)ppdVar25 + lVar13 * 4),
               (ulong)*(uint *)((long)ppdVar21 + lVar13 * 4),
               (ulong)*(uint *)((long)ppdVar23 + lVar13 * 4),uVar22);
        lVar13 = (long)this->pointmarkindex;
        uVar17 = (ulong)*(uint *)(lVar9 + lVar13 * 4);
        uVar14 = (ulong)*(uint *)(lVar15 + lVar13 * 4);
        uVar12 = (ulong)*(uint *)(lVar5 + lVar13 * 4);
        __format = "  Facet 2: [%d, %d, %d] #%d.\n";
        local_a8 = (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4);
      }
      else {
        if (iVar16 != 1) goto LAB_00115804;
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n",*ppdVar4,ppdVar4[1],ppdVar4[2]);
        printf("  Segment : [%d, %d], #%d (%d)\n",
               (ulong)*(uint *)((long)ppdVar25 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4),uVar22,uVar20);
        lVar13 = (long)this->pointmarkindex;
        uVar17 = (ulong)*(uint *)(lVar9 + lVar13 * 4);
        uVar14 = (ulong)*(uint *)(lVar15 + lVar13 * 4);
        uVar12 = (ulong)*(uint *)(lVar5 + lVar13 * 4);
        __format = "  Facet   : [%d, %d, %d]  #%d.\n";
        local_a8 = (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4);
      }
    }
    break;
  case ACROSSEDGE:
    if (itet->tet[8] == (tetrahedron)0x0) {
      return 0;
    }
    pdVar2 = itet->tet[8][ver2edge[itet->ver]];
    if (pdVar2 == (double *)0x0) {
      return 0;
    }
    local_a8 = (ulong)uVar22;
    uVar18 = (ulong)pdVar2 & 0xfffffffffffffff8;
    uVar24 = *(ulong *)(uVar18 + (ulong)((uint)pdVar2 & 6) * 4) & 0xfffffffffffffff8;
    uVar12 = (ulong)(((uint)pdVar2 & 7) << 2);
    pdVar2 = *(double **)(uVar18 + (long)*(int *)((long)sorgpivot + uVar12) * 8);
    pdVar3 = *(double **)(uVar18 + (long)*(int *)((long)sdestpivot + uVar12) * 8);
    tp = 0.0;
    uVar27 = 0;
    tq = 0.0;
    linelineint(this,e1,e2,pdVar2,pdVar3,ip,&tp,&tq,in_stack_ffffffffffffff50);
    if (iVar16 == 2) {
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",ip[0],CONCAT44(ip[1]._4_4_,ip[1]._0_4_),ip[2]);
      if (uVar24 != 0) {
        uVar27 = *(uint *)(uVar24 + (long)this->shmarkindex * 4);
      }
      printf("  Segment: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)pdVar2 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4),(ulong)uVar27);
      lVar9 = (long)this->pointmarkindex;
      uVar17 = (ulong)*(uint *)((long)ppdVar25 + lVar9 * 4);
      uVar14 = (ulong)*(uint *)((long)ppdVar21 + lVar9 * 4);
      uVar12 = (ulong)*(uint *)((long)ppdVar23 + lVar9 * 4);
      __format = "  Facet:   [%d, %d, %d] #%d.\n";
    }
    else {
      if (iVar16 != 1) goto LAB_00115804;
      printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",ip[0],
             CONCAT44(ip[1]._4_4_,ip[1]._0_4_),ip[2]);
      printf("  Segment 1: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)ppdVar25 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)ppdVar21 + (long)this->pointmarkindex * 4),uVar22,uVar20);
      uVar17 = (ulong)*(uint *)((long)pdVar2 + (long)this->pointmarkindex * 4);
      uVar14 = (ulong)*(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4);
      uVar12 = (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4);
      __format = "  Segment 2: [%d, %d] #%d (%d)\n";
      if (uVar24 == 0) goto LAB_001150e5;
      uVar22 = *(uint *)(uVar24 + (long)this->shmarkindex * 4);
LAB_0011567b:
      local_a8 = (ulong)uVar22;
    }
    break;
  case ACROSSFACE:
    if (itet->tet[9] == (tetrahedron)0x0) {
      return 0;
    }
    pdVar2 = itet->tet[9][itet->ver & 3];
    if (pdVar2 == (double *)0x0) {
      return 0;
    }
    uVar18 = (ulong)pdVar2 & 0xfffffffffffffff8;
    iVar1 = tspivottbl[itet->ver][(uint)pdVar2 & 7];
    pdVar2 = *(double **)(uVar18 + (long)sorgpivot[iVar1] * 8);
    pdVar3 = *(double **)(uVar18 + (long)sdestpivot[iVar1] * 8);
    pc = *(double **)(uVar18 + (long)sapexpivot[iVar1] * 8);
    u = 0.0;
    planelineint((tetgenmesh *)ip,pdVar2,pdVar3,pc,e1,e2,ip,&u);
    if (iVar16 == 2) {
      printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",ip[0],
             CONCAT44(ip[1]._4_4_,ip[1]._0_4_),ip[2]);
      lVar9 = (long)this->pointmarkindex;
      uVar12 = (ulong)*(uint *)((long)ppdVar23 + lVar9 * 4);
      __format = "  Facet 2: [%d, %d, %d] #%d.\n";
      pcVar19 = "  Facet 1: [%d, %d, %d] #%d.\n";
      uVar20 = (ulong)uVar22;
    }
    else {
      if (iVar16 != 1) goto LAB_00115804;
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",ip[0],CONCAT44(ip[1]._4_4_,ip[1]._0_4_),ip[2]);
      lVar9 = (long)this->pointmarkindex;
      __format = "  Facet:   [%d, %d, %d] #%d.\n";
      pcVar19 = "  Segment: [%d, %d] #%d (%d)\n";
      uVar12 = (ulong)uVar22;
    }
    printf(pcVar19,(ulong)*(uint *)((long)ppdVar25 + lVar9 * 4),
           (ulong)*(uint *)((long)ppdVar21 + lVar9 * 4),uVar12,uVar20);
    lVar9 = (long)this->pointmarkindex;
    uVar17 = (ulong)*(uint *)((long)pdVar2 + lVar9 * 4);
    uVar14 = (ulong)*(uint *)((long)pdVar3 + lVar9 * 4);
    uVar12 = (ulong)*(uint *)((long)pc + lVar9 * 4);
    local_a8 = (ulong)*(uint *)(uVar18 + (long)this->shmarkindex * 4);
  }
  printf(__format,uVar17,uVar14,uVar12,local_a8);
LAB_00115804:
  puts("A self-intersection was detected. Program stopped.");
  puts("Hint: use -d option to detect all self-intersections.");
  exit(3);
}

Assistant:

int tetgenmesh::report_selfint_edge(point e1, point e2, face *iedge,
  triface* itet, enum interresult dir)
{
  point forg = NULL, fdest = NULL, fapex = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  if (iedge != NULL) {
    if (iedge->sh[5] != NULL) {
      etype = 2;  // A subface
      forg = e1;
      fdest = e2;
      fapex = sapex(*iedge);
      facemark = shellmark(*iedge);
    } else {
      etype = 1;  // A segment
      forg = farsorg(*iedge);
      fdest = farsdest(*iedge);
      // Get a facet containing this segment.
      face parentsh;
      spivot(*iedge, parentsh);
      if (parentsh.sh != NULL) {
        facemark = shellmark(parentsh);
      }
    }
    geomtag = shellmark(*iedge);
  }

  if (dir == SHAREEDGE) {
    // Two edges (segments) are coincide.
    face colseg;
    tsspivot1(*itet, colseg);
    if (etype == 1) {
      if (colseg.sh != iedge->sh) {
        face parentsh;
        spivot(colseg, parentsh);
        printf("PLC Error:  Two segments are overlapping.\n");
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(sorg(colseg)),
               pointmark(sdest(colseg)), shellmark(colseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(forg),
               pointmark(fdest), geomtag, facemark);
      } else {
        // Two identical segments. Why report it?
        terminatetetgen(this, 2); 
      }
    } else if (etype == 2) {
      printf("PLC Error:  A segment lies in a facet.\n");
      printf("  Segment: [%d, %d] #%d\n", pointmark(sorg(colseg)),
             pointmark(sdest(colseg)), shellmark(colseg));
      printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
             pointmark(fdest), pointmark(fapex), geomtag);
    }
  } else if (dir == SHAREFACE) {
    // Two triangles (subfaces) are coincide.
	face colface;
    tspivot(*itet, colface);
	if (etype == 2) {
	  if (colface.sh != iedge->sh) {
	    printf("PLC Error:  Two facets are overlapping.\n");
		printf("  Facet 1:  [%d,%d,%d] #%d\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
		printf("  Facet 2:  [%d,%d,%d] #%d\n", pointmark(sorg(colface)), 
             pointmark(sdest(colface)), pointmark(sapex(colface)), 
			 shellmark(colface));
	  } else {
	    // Two identical subfaces. Why report it?
        terminatetetgen(this, 2); 
	  }
	} else {
	  terminatetetgen(this, 2);
	}
  } else if (dir == ACROSSVERT) {
    point pp = dest(*itet);
    if ((pointtype(pp) == RIDGEVERTEX) || (pointtype(pp) == FACETVERTEX)
        || (pointtype(pp) == VOLVERTEX)) {
      if (etype == 1) {
        printf("PLC Error:  A vertex lies in a segment.\n");
        printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
      } else if (etype == 2) {
        printf("PLC Error:  A vertex lies in a facet.\n");
        printf("  Vertex: [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Facet:  [%d,%d,%d] #%d\n", pointmark(forg), pointmark(fdest),
               pointmark(fapex), geomtag);
      }
    } else if (pointtype(pp) == FREESEGVERTEX) {
      face parentseg, parentsh;
      sdecode(point2sh(pp), parentseg);
      spivot(parentseg, parentsh);
      if (parentseg.sh != NULL) {
        point p1 = farsorg(parentseg);
        point p2 = farsdest(parentseg);
        if (etype == 1) {
          printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Segment 1: [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Segment 2: [%d, %d], #%d (%d)\n", pointmark(p1), 
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
        } else if (etype == 2) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment: [%d, %d], #%d (%d)\n", pointmark(p1),
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEFACETVERTEX) {
      face parentsh;
      sdecode(point2sh(pp), parentsh);
      if (parentsh.sh != NULL) {
        point p1 = sorg(parentsh);
        point p2 = sdest(parentsh);
        point p3 = sapex(parentsh);
        if (etype == 1) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment : [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Facet   : [%d, %d, %d]  #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        } else if (etype == 2) {
          printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
          printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEVOLVERTEX) {
      // This is not a PLC error. 
      // We should shift the vertex.
      // not down yet.
      terminatetetgen(this, 2); // Report a bug.
    } else {
      terminatetetgen(this, 2); // Report a bug.
    }
    terminatetetgen(this, 3);
  } else if (dir == ACROSSEDGE) {
    if (issubseg(*itet)) {
      face checkseg;
      tsspivot1(*itet, checkseg);
      face parentsh;
      spivot(checkseg, parentsh);
      // Calulcate the intersecting point.
      point p1 = sorg(checkseg);
      point p2 = sdest(checkseg);
      REAL P[3], Q[3], tp = 0, tq = 0;
      linelineint(e1, e2, p1, p2, P, Q, &tp, &tq);
      if (etype == 1) {
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
               P[0], P[1], P[2]);
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
      } else if (etype == 2) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", P[0], P[1], P[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
      }
      terminatetetgen(this, 3);
    }
  } else if (dir == ACROSSFACE) {
    if (issubface(*itet)) {
      face checksh;
      tspivot(*itet, checksh);
      point p1 = sorg(checksh);
      point p2 = sdest(checksh);
      point p3 = sapex(checksh);
      REAL ip[3], u = 0;
      planelineint(p1, p2, p3, e1, e2, ip, &u);
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      } else if (etype == 2) {
        printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
               ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
        printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      }
      terminatetetgen(this, 3);
    }
  } else {
    // An unknown 'dir'.
    terminatetetgen(this, 2);
  }
  return 0;
}